

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TType * __thiscall
glslang::HlslParseContext::split
          (HlslParseContext *this,TType *type,TString *name,TQualifier *outerQualifier)

{
  TType *pTVar1;
  iterator this_00;
  bool bVar2;
  uint uVar3;
  int iVar4;
  pointer pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_78;
  const_iterator local_50;
  TTypeLoc *local_48;
  __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
  local_40;
  __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
  local_38;
  iterator ioType;
  TTypeList *userStructure;
  TQualifier *outerQualifier_local;
  TString *name_local;
  TType *type_local;
  HlslParseContext *this_local;
  
  uVar3 = (*type->_vptr_TType[0x25])();
  if ((uVar3 & 1) != 0) {
    ioType._M_current = (TTypeLoc *)TType::getWritableStruct(type);
    local_38._M_current =
         (TTypeLoc *)
         std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::begin
                   ((vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *)
                    ioType._M_current);
    while( true ) {
      local_40._M_current =
           (TTypeLoc *)
           std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::end
                     (ioType._M_current);
      bVar2 = __gnu_cxx::operator!=(&local_38,&local_40);
      if (!bVar2) break;
      pTVar5 = __gnu_cxx::
               __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
               ::operator->(&local_38);
      uVar3 = (*pTVar5->type->_vptr_TType[0x29])();
      if ((uVar3 & 1) == 0) {
        pTVar5 = __gnu_cxx::
                 __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                 ::operator->(&local_38);
        pTVar1 = pTVar5->type;
        std::operator+(&local_a0,name,".");
        pTVar5 = __gnu_cxx::
                 __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                 ::operator->(&local_38);
        iVar4 = (*pTVar5->type->_vptr_TType[6])();
        std::operator+(&local_78,&local_a0,
                       (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )CONCAT44(extraout_var_00,iVar4));
        split(this,pTVar1,&local_78,outerQualifier);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_78);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_a0);
        __gnu_cxx::
        __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
        ::operator++(&local_38);
      }
      else {
        pTVar5 = __gnu_cxx::
                 __normal_iterator<glslang::TTypeLoc_*,_std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>_>
                 ::operator->(&local_38);
        pTVar1 = pTVar5->type;
        iVar4 = (*type->_vptr_TType[0x13])();
        splitBuiltIn(this,name,pTVar1,(TArraySizes *)CONCAT44(extraout_var,iVar4),outerQualifier);
        this_00 = ioType;
        __gnu_cxx::
        __normal_iterator<glslang::TTypeLoc_const*,std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>>
        ::__normal_iterator<glslang::TTypeLoc*>
                  ((__normal_iterator<glslang::TTypeLoc_const*,std::vector<glslang::TTypeLoc,glslang::pool_allocator<glslang::TTypeLoc>>>
                    *)&local_50,&local_38);
        local_48 = (TTypeLoc *)
                   std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                   erase(this_00._M_current,local_50);
        local_38._M_current = local_48;
      }
    }
  }
  return type;
}

Assistant:

const TType& HlslParseContext::split(const TType& type, const TString& name, const TQualifier& outerQualifier)
{
    if (type.isStruct()) {
        TTypeList* userStructure = type.getWritableStruct();
        for (auto ioType = userStructure->begin(); ioType != userStructure->end(); ) {
            if (ioType->type->isBuiltIn()) {
                // move out the built-in
                splitBuiltIn(name, *ioType->type, type.getArraySizes(), outerQualifier);
                ioType = userStructure->erase(ioType);
            } else {
                split(*ioType->type, name + "." + ioType->type->getFieldName(), outerQualifier);
                ++ioType;
            }
        }
    }

    return type;
}